

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

void CCEXP::AddTable<short>(CCEXP *obj,char *matname,char *typeName,size_t MaxRows)

{
  int iVar1;
  char *pcVar2;
  MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_> *pMVar3;
  CCEXPMat<short> *pCVar4;
  size_t sVar5;
  __shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2> *this;
  char *local_b0;
  char *local_a8;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  int ret;
  CCEXPMat<short> *U;
  shared_ptr<CCEXP::CCEXPBase> local_40;
  size_t local_30;
  size_t rd;
  size_t MaxRows_local;
  char *typeName_local;
  char *matname_local;
  CCEXP *obj_local;
  
  obj->ErrorId = 0;
  if ((obj->isActive & 1U) != 0) {
    rd = MaxRows;
    MaxRows_local = (size_t)typeName;
    typeName_local = matname;
    matname_local = (char *)obj;
    if (obj->Status == 1) {
      obj->Status = 2;
      local_30 = CCEXP::checkDuplicatedNames(obj,matname);
      if (local_30 == 0) {
        pMVar3 = (MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_> *)(matname_local + 0x30);
        pCVar4 = (CCEXPMat<short> *)operator_new(0xb8);
        CCEXPMat<short>::CCEXPMat(pCVar4);
        std::shared_ptr<CCEXP::CCEXPBase>::shared_ptr<CCEXP::CCEXPBase,void>
                  (&local_40,(CCEXPBase *)pCVar4);
        ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::push_back(pMVar3,&local_40);
        std::shared_ptr<CCEXP::CCEXPBase>::~shared_ptr(&local_40);
        pMVar3 = (MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_> *)(matname_local + 0x30);
        sVar5 = ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::size
                          ((MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_> *)(matname_local + 0x30));
        this = &ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::operator[]
                          (pMVar3,sVar5 - 1)->
                super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>;
        pCVar4 = (CCEXPMat<short> *)
                 std::__shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>::get(this);
        iVar1 = CCEXPMat<short>::Initialize
                          (pCVar4,typeName_local,(char *)MaxRows_local,rd,(CCEXP *)matname_local);
        if (iVar1 == 0) {
          matname_local[8] = '\x01';
          matname_local[9] = '\0';
          matname_local[10] = '\0';
          matname_local[0xb] = '\0';
        }
        else {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x5c);
            if (pcVar2 == (char *)0x0) {
              local_b0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
              ;
            }
            else {
              local_b0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                 ,0x5c);
              local_b0 = local_b0 + 1;
            }
            local_a8 = local_b0;
          }
          else {
            local_a8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                               ,0x2f);
            local_a8 = local_a8 + 1;
          }
          CECS::RecError((CECS *)CCEXPECS,-9999,1,local_a8,0x1fb,
                         "[%s]: AddTable():: Internal error occured during initialization()!",
                         matname_local + 0x70);
        }
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
          if (pcVar2 == (char *)0x0) {
            local_80 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
            ;
          }
          else {
            local_80 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                               ,0x5c);
            local_80 = local_80 + 1;
          }
          local_78 = local_80;
        }
        else {
          local_78 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x2f);
          local_78 = local_78 + 1;
        }
        CECS::RecError((CECS *)CCEXPECS,-9999,1,local_78,0x1f7,
                       "[%s]: AddTable()::  Table with name [%s] already exist!",
                       matname_local + 0x70,typeName_local);
      }
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x5c);
        if (pcVar2 == (char *)0x0) {
          local_70 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
          ;
        }
        else {
          local_70 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x5c);
          local_70 = local_70 + 1;
        }
        local_68 = local_70;
      }
      else {
        local_68 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x2f);
        local_68 = local_68 + 1;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,local_68,500,
                     "[%s]: AddTable():: CCEXP object has wrong status.",matname_local + 0x70);
    }
  }
  return;
}

Assistant:

inline void AddTable (
	CCEXP &obj,
	const char* matname,
	const char* typeName,
	size_t MaxRows = 0
) {
	obj.ErrorId = 0;
	if (!obj.isActive) return;
	CECS_ERR(CCEXPECS,obj.Status != CCEXPORTMAT_READY,"[%s]: AddTable():: CCEXP object has wrong status." , obj.SavingFile );
	obj.Status = CCEXPORTMAT_ACTIVE;
	size_t rd = obj.checkDuplicatedNames(matname);
	CECS_ERR(CCEXPECS,rd > 0,"[%s]: AddTable()::  Table with name [%s] already exist!", obj.SavingFile, matname);
	obj.M.push_back(shared_ptr<CCEXPBase>((CCEXPBase*) new CCEXPMat<T>));
	CCEXPMat<T>* U = static_cast<CCEXPMat<T>*>(obj.M[obj.M.size()-1].get());
	int ret = U->Initialize(matname, typeName, MaxRows, &obj);
	CECS_ERR(CCEXPECS,ret != 0,"[%s]: AddTable():: Internal error occured during initialization()!", obj.SavingFile);
	obj.Status = CCEXPORTMAT_READY;
}